

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QtPrivate::QCalendarView::mouseMoveEvent(QCalendarView *this,QMouseEvent *event)

{
  long lVar1;
  bool bVar2;
  QCalendarModel *this_00;
  QCalendarView *in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  QCalendarModel *calendarModel;
  int col;
  int row;
  QDate date;
  QAbstractItemView *in_stack_ffffffffffffff80;
  QDate in_stack_ffffffffffffffb8;
  QMouseEvent *in_stack_ffffffffffffffd8;
  QAbstractItemView *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemView::model(in_stack_ffffffffffffff80);
  this_00 = qobject_cast<QtPrivate::QCalendarModel*>((QObject *)0x51ad1d);
  if (this_00 == (QCalendarModel *)0x0) {
    QAbstractItemView::mouseMoveEvent(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  else if ((*(byte *)(in_RDI + 10) & 1) == 0) {
    if ((*(byte *)((long)in_RDI + 0x29) & 1) == 0) {
      QEvent::ignore((QEvent *)in_RSI);
    }
    else {
      handleMouseEvent(in_RSI,(QMouseEvent *)this_00);
      bVar2 = QDate::isValid((QDate *)in_stack_ffffffffffffff80);
      if (bVar2) {
        QAbstractItemView::model(in_stack_ffffffffffffff80);
        QCalendarModel::cellForDate
                  (this_00,in_stack_ffffffffffffffb8,in_RDI,(int *)in_stack_ffffffffffffff80);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarView::mouseMoveEvent(QMouseEvent *event)
{
    QCalendarModel *calendarModel = qobject_cast<QCalendarModel *>(model());
    if (!calendarModel) {
        QTableView::mouseMoveEvent(event);
        return;
    }

    if (readOnly)
        return;

    if (validDateClicked) {
       QDate date = handleMouseEvent(event);
        if (date.isValid()) {
            int row = -1, col = -1;
            static_cast<QCalendarModel *>(model())->cellForDate(date, &row, &col);
            if (row != -1 && col != -1) {
                selectionModel()->setCurrentIndex(model()->index(row, col), QItemSelectionModel::NoUpdate);
            }
        }
    } else {
        event->ignore();
    }
}